

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci;
  global_State *pgVar1;
  GCObject *pGVar2;
  char in_AL;
  uint uVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_138;
  char local_118 [64];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_138.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_138.overflow_arg_area = &argp[0].overflow_arg_area;
  local_138.gp_offset = 0x10;
  local_138.fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pcVar4 = luaO_pushvfstring(L,fmt,&local_138);
  ci = L->ci;
  if ((ci->func->tt == 6) && ((((ci->func->value).gc)->h).flags == '\0')) {
    uVar3 = currentpc(L,ci);
    pgVar1 = (((ci->func->value).gc)->th).l_G;
    if ((int)uVar3 < 0) {
      uVar3 = 0xffffffff;
    }
    else {
      pGVar2 = pgVar1->rootgc;
      if (pGVar2 == (GCObject *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(uint *)((long)pGVar2 + (ulong)uVar3 * 4);
      }
    }
    luaO_chunkid(local_118,(char *)&(pgVar1->grayagain->h).array,0x3c);
    luaO_pushfstring(L,"%s:%d: %s",local_118,(ulong)uVar3,pcVar4);
  }
  luaG_errormsg(L);
  return;
}

Assistant:

void luaG_runerror (lua_State *L, const char *fmt, ...) {
  va_list argp;
  va_start(argp, fmt);
  addinfo(L, luaO_pushvfstring(L, fmt, argp));
  va_end(argp);
  luaG_errormsg(L);
}